

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.hpp
# Opt level: O2

void __thiscall
afsm::
priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
::defer_event<afsm::test::events::exec_prepared>
          (priority_state_machine<afsm::test::connection_pri_fsm_def,_std::mutex,_afsm::test::test_fsm_observer,_afsm::detail::observer_wrapper>
           *this,exec_prepared *event,event_priority_type priority)

{
  event_priority_type local_3c;
  anon_class_16_3_3ecbcd59 local_38;
  
  local_3c = priority;
  std::mutex::lock(&this->deferred_mutex_);
  detail::observer_wrapper<afsm::test::test_fsm_observer>::
  defer_event<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>,afsm::test::events::exec_prepared>
            (&this->super_observer_wrapper<afsm::test::test_fsm_observer>,this,event);
  local_38.priority = priority;
  local_38.this = this;
  std::
  priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
  ::
  emplace<afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::defer_event<afsm::test::events::exec_prepared>(afsm::test::events::exec_prepared&&,int)::_lambda()_1_,int&>
            ((priority_queue<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::vector<std::pair<std::function<afsm::actions::event_process_result()>,int>,std::allocator<std::pair<std::function<afsm::actions::event_process_result()>,int>>>,afsm::priority_state_machine<afsm::test::connection_pri_fsm_def,std::mutex,afsm::test::test_fsm_observer,afsm::detail::observer_wrapper>::event_comparison>
              *)&this->deferred_events_,&local_38,&local_3c);
  pthread_mutex_unlock((pthread_mutex_t *)&this->deferred_mutex_);
  return;
}

Assistant:

void
    defer_event(Event&& event, event_priority_type priority)
    {
        lock_guard lock{deferred_mutex_};
        observer_wrapper::defer_event(*this, ::std::forward<Event>(event));
        Event evt{::std::forward<Event>(event)};
        deferred_events_.emplace([&, evt, priority]() mutable {
            return process_event_dispatch(::std::move(evt), priority);
        }, priority);
    }